

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float a_min,float a_max,int num_segments)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 local_38;
  float local_30;
  int local_2c;
  float a;
  int i;
  int num_segments_local;
  float a_max_local;
  float a_min_local;
  float radius_local;
  ImVec2 *centre_local;
  ImDrawList *this_local;
  
  a = (float)num_segments;
  i = (int)a_max;
  num_segments_local = (int)a_min;
  a_max_local = radius;
  _a_min_local = centre;
  centre_local = (ImVec2 *)this;
  if ((radius != 0.0) || (NAN(radius))) {
    ImVector<ImVec2>::reserve(&this->_Path,(this->_Path).Size + num_segments + 1);
    for (local_2c = 0; local_2c <= (int)a; local_2c = local_2c + 1) {
      local_30 = ((float)local_2c / (float)(int)a) * ((float)i - (float)num_segments_local) +
                 (float)num_segments_local;
      fVar1 = _a_min_local->x;
      fVar3 = ImCos(local_30);
      fVar3 = fVar3 * a_max_local;
      fVar2 = _a_min_local->y;
      fVar4 = ImSin(local_30);
      ImVec2::ImVec2(&local_38,fVar3 + fVar1,fVar4 * a_max_local + fVar2);
      ImVector<ImVec2>::push_back(&this->_Path,&local_38);
    }
  }
  else {
    ImVector<ImVec2>::push_back(&this->_Path,centre);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float a_min, float a_max, int num_segments)
{
    if (radius == 0.0f)
    {
        _Path.push_back(centre);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(centre.x + ImCos(a) * radius, centre.y + ImSin(a) * radius));
    }
}